

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrapProperties(ElementFormControlTextArea *this)

{
  bool bVar1;
  Property PStack_68;
  
  bVar1 = GetWordWrap(this);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&PStack_68,Auto - bVar1);
  Element::SetProperty((Element *)this,OverflowX,&PStack_68);
  Property::~Property(&PStack_68);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&PStack_68,Auto);
  Element::SetProperty((Element *)this,OverflowY,&PStack_68);
  Property::~Property(&PStack_68);
  Property::Property<Rml::Style::WhiteSpace,Rml::Style::WhiteSpace>(&PStack_68,bVar1 * '\x02' + Pre)
  ;
  Element::SetProperty((Element *)this,WhiteSpace,&PStack_68);
  Property::~Property(&PStack_68);
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrapProperties()
{
	const bool word_wrap = GetWordWrap();
	SetProperty(PropertyId::OverflowX, Property(word_wrap ? Style::Overflow::Hidden : Style::Overflow::Auto));
	SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Auto));
	SetProperty(PropertyId::WhiteSpace, Property(word_wrap ? Style::WhiteSpace::Prewrap : Style::WhiteSpace::Pre));
}